

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

ostream * operator<<(ostream *stream,Request *req)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  undefined8 *puVar3;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,*(char **)req,*(long *)(req + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,*(char **)(req + 0x20),*(long *)(req + 0x28));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," HTTP/",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)(req + 0x40));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)(req + 0x44));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  puVar3 = *(undefined8 **)(req + 0x48);
  if (puVar3 != *(undefined8 **)(req + 0x50)) {
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)*puVar3,puVar3[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)puVar3[4],puVar3[5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      puVar3 = puVar3 + 8;
    } while (puVar3 != *(undefined8 **)(req + 0x50));
  }
  __s = *(char **)(req + 0x60);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"+ keep-alive: ",0xe);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(stream,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return stream;
}

Assistant:

std::ostream & operator<< (std::ostream &stream, const httpparser::Request &req)
{
    stream << req.method << " " << req.uri << " HTTP/" 
           << req.versionMajor << "." << req.versionMinor << "\n";
           
    for(std::vector<httpparser::Request::HeaderItem>::const_iterator it = req.headers.begin();
        it != req.headers.end(); ++it)
    {
        stream << it->name << ": " << it->value << "\n";
    }
    
    stream << req.content.data() << "\n";
    stream << "+ keep-alive: " << req.keepAlive << "\n";;
    
    return stream;
}